

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O2

void __thiscall
prometheus::Exposer::RemoveCollectable
          (Exposer *this,weak_ptr<prometheus::Collectable> *collectable,string *uri)

{
  Endpoint *this_00;
  
  std::mutex::lock(&this->mutex_);
  this_00 = GetEndpointForUri(this,uri);
  detail::Endpoint::RemoveCollectable(this_00,collectable);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void Exposer::RemoveCollectable(const std::weak_ptr<Collectable>& collectable,
                                const std::string& uri) {
  std::lock_guard<std::mutex> lock{mutex_};
  auto& endpoint = GetEndpointForUri(uri);
  endpoint.RemoveCollectable(collectable);
}